

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O3

bool __thiscall StatsByIP::RegisterNewOption(StatsByIP *this,uint16_t option_code)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  undefined2 in_register_00000032;
  
  uVar2 = CONCAT22(in_register_00000032,option_code) * 0x66 ^
          CONCAT22(in_register_00000032,option_code);
  uVar2 = (uVar2 >> 0xb ^ uVar2) * 0x1f;
  uVar2 = uVar2 >> 6 ^ uVar2;
  uVar3 = 1L << ((byte)uVar2 & 0x3f);
  uVar1 = this->option_mask;
  if ((uVar1 >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
    this->option_mask = uVar1 | uVar3;
  }
  return (uVar1 & uVar3) == 0;
}

Assistant:

bool StatsByIP::RegisterNewOption(uint16_t option_code)
{
    uint32_t option_hash = option_code;

    /* Compute a minimal 16 bit hash */
    option_hash ^= (option_code * 102);
    option_hash ^= (option_hash >> 11);
    option_hash *= 31;
    option_hash ^= (option_hash >> 6);

    /* Retain only the last 6 bits */
    option_hash &= 0x3F;
    uint64_t bit_mask = (1ull << option_hash);

    /* check the mask */
    bool ret = (option_mask&bit_mask) == 0;

    if (ret) {
        option_mask |= bit_mask;
    }

    return ret;
}